

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinter.cpp
# Opt level: O2

void __thiscall QPrinter::setOutputFileName(QPrinter *this,QString *fileName)

{
  QPrinterPrivate *this_00;
  int iVar1;
  OutputFormat format;
  long in_FS_OFFSET;
  QLatin1String QVar2;
  QFileInfo fi;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  iVar1 = (*this_00->printEngine->_vptr_QPrintEngine[7])();
  if (iVar1 == 1) {
    local_58._0_4_ = 2;
    local_58._20_4_ = 0;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_40 = "default";
    QMessageLogger::warning
              ((char *)local_58.data,"%s: Cannot be changed while printer is active",
               "QPrinter::setOutputFileName");
    goto LAB_001325ab;
  }
  _fi = 0xaaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(&fi,(QString *)fileName);
  QFileInfo::suffix();
  format = NativeFormat;
  QVar2.m_data = (char *)0x3;
  QVar2.m_size = (qsizetype)&local_58;
  iVar1 = QString::compare(QVar2,0x154042);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if (iVar1 == 0) {
    format = PdfFormat;
LAB_00132571:
    setOutputFormat(this,format);
  }
  else if ((fileName->d).size == 0) goto LAB_00132571;
  QVariant::QVariant((QVariant *)&local_58,(QString *)fileName);
  QPrinterPrivate::setProperty(this_00,PPK_OutputFileName,(QVariant *)&local_58);
  QVariant::~QVariant((QVariant *)&local_58);
  QFileInfo::~QFileInfo(&fi);
LAB_001325ab:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPrinter::setOutputFileName(const QString &fileName)
{
    Q_D(QPrinter);
    ABORT_IF_ACTIVE("QPrinter::setOutputFileName");

    QFileInfo fi(fileName);
    if (!fi.suffix().compare("pdf"_L1, Qt::CaseInsensitive))
        setOutputFormat(QPrinter::PdfFormat);
    else if (fileName.isEmpty())
        setOutputFormat(QPrinter::NativeFormat);

    d->setProperty(QPrintEngine::PPK_OutputFileName, fileName);
}